

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O2

void (anonymous_namespace)::
     seed_rng<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,624ul>
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *engine)

{
  seed_seq seedseq;
  array<unsigned_int,_1248UL> numbers;
  random_device rnddev;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2740;
  uint local_2728 [1248];
  random_device local_13a8;
  
  memset(local_2728,0,0x1380);
  std::random_device::random_device(&local_13a8);
  std::generate<unsigned_int*,std::reference_wrapper<std::random_device>>
            (local_2728,(uint *)&local_13a8,&local_13a8);
  std::seed_seq::seed_seq<unsigned_int_const*>
            ((seed_seq *)&local_2740,local_2728,(uint *)&local_13a8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(engine,(seed_seq *)&local_2740);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2740);
  std::random_device::~random_device(&local_13a8);
  return;
}

Assistant:

void seed_rng(EngineT& engine)
   {
      using engine_type = typename EngineT::result_type;
      using device_type = std::random_device::result_type;
      using seedseq_type = std::seed_seq::result_type;
      constexpr auto bytes_needed = StateSize * sizeof(engine_type);
      constexpr auto numbers_needed = (sizeof(device_type) < sizeof(seedseq_type))
         ? (bytes_needed / sizeof(device_type))
         : (bytes_needed / sizeof(seedseq_type));
      std::array<device_type, numbers_needed> numbers{};
      std::random_device rnddev{};
      std::generate(std::begin(numbers), std::end(numbers), std::ref(rnddev));
      std::seed_seq seedseq(std::cbegin(numbers), std::cend(numbers));
      engine.seed(seedseq);
   }